

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_PitchDetector.cpp
# Opt level: O0

int PitchDetector::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  float *pfVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  EffectData *pEVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  int local_80;
  int c;
  float a;
  int n_1;
  float maxval;
  int maxbin;
  int endbin;
  int startbin;
  int i_3;
  int hicut;
  int locut;
  int i_2;
  int i_1;
  int i;
  float input;
  uint n;
  float oscpitch;
  float monitor;
  float sampletime;
  Data *data;
  int outchannels_local;
  int inchannels_local;
  uint length_local;
  float *outbuffer_local;
  float *inbuffer_local;
  UnityAudioEffectState *state_local;
  
  pEVar6 = UnityAudioEffectState::GetEffectData<PitchDetector::EffectData>(state);
  uVar3 = (state->field_0).field_0.samplerate;
  fVar2 = (pEVar6->field_0).data.p[7];
  fVar8 = powf(2.0,(pEVar6->field_0).data.p[6] / 12.0);
  memcpy(outbuffer,inbuffer,(ulong)(length * inchannels) << 2);
  for (i = 0; (uint)i < length; i = i + 1) {
    fVar9 = inbuffer[(uint)(i * inchannels)];
    (pEVar6->field_0).data.env =
         (ABS(fVar9) - (pEVar6->field_0).data.env) * 0.01 + (pEVar6->field_0).data.env;
    *(float *)((long)&pEVar6->field_0 + (long)((pEVar6->field_0).data.counter + 0xc00) * 4 + 0x2c) =
         fVar9;
    iVar4 = (pEVar6->field_0).data.counter + 1;
    (pEVar6->field_0).data.counter = iVar4;
    if (iVar4 == 0x400) {
      (pEVar6->field_0).data.counter = 0;
      for (i_2 = 0; i_2 < 0xc00; i_2 = i_2 + 1) {
        *(undefined4 *)((long)&pEVar6->field_0 + (long)i_2 * 4 + 0x2c) =
             *(undefined4 *)((long)&pEVar6->field_0 + (long)(i_2 + 0x400) * 4 + 0x2c);
      }
      for (locut = 0; locut < 0x1000; locut = locut + 1) {
        *(float *)((long)&pEVar6->field_0 + (long)locut * 8 + 0x1002c) =
             *(float *)((long)&pEVar6->field_0 + (long)locut * 4 + 0x2c) *
             *(float *)((long)&pEVar6->field_0 + (long)locut * 4 + 0x402c);
        *(undefined4 *)((long)&pEVar6->field_0 + (long)locut * 8 + 0x10030) = 0;
      }
      for (hicut = 0x1000; hicut < 0x2000; hicut = hicut + 1) {
        *(undefined4 *)((long)&pEVar6->field_0 + (long)hicut * 8 + 0x1002c) = 0;
        *(undefined4 *)((long)&pEVar6->field_0 + (long)hicut * 8 + 0x10030) = 0;
      }
      FFT::Forward((pEVar6->field_0).data.spec,0x2000,true);
      iVar4 = (int)(pEVar6->field_0).data.p[1];
      iVar5 = (int)(pEVar6->field_0).data.p[2];
      memset((void *)((long)&pEVar6->field_0 + 0x1002c),0,(long)iVar4 << 3);
      memset((void *)((long)&pEVar6->field_0 + (long)iVar5 * 8 + 0x1002c),0,
             (long)(iVar5 * -2 + 0x2000) << 3);
      memset((void *)((long)pEVar6 + (long)iVar4 * -8 + 0x2002c),0,(long)iVar4 << 3);
      for (endbin = 0; endbin < 0x2000; endbin = endbin + 1) {
        fVar9 = UnityComplexNumberT<float>::Magnitude2
                          ((UnityComplexNumberT<float> *)
                           ((long)&pEVar6->field_0 + (long)endbin * 8 + 0x1002c));
        *(float *)((long)&pEVar6->field_0 + (long)endbin * 8 + 0x1002c) =
             fVar9 * *(float *)((long)&pEVar6->field_0 + (ulong)(uint)i * 4 + 0x802c);
        *(undefined4 *)((long)&pEVar6->field_0 + (long)endbin * 8 + 0x10030) = 0;
        *(undefined4 *)(debugdata + (long)endbin * 4) =
             *(undefined4 *)((long)&pEVar6->field_0 + (long)endbin * 8 + 0x1002c);
      }
      FFT::Backward((pEVar6->field_0).data.spec,0x2000,true);
      n_1 = 0;
      a = 0.0;
      for (c = (int)(pEVar6->field_0).data.p[3]; c < (int)(pEVar6->field_0).data.p[4]; c = c + 1) {
        fVar9 = *(float *)((long)&pEVar6->field_0 + (long)c * 8 + 0x1002c);
        if (a < fVar9) {
          n_1 = c;
          a = fVar9;
        }
      }
      fVar9 = (pEVar6->field_0).data.env;
      pfVar1 = (pEVar6->field_0).data.p + 5;
      if ((*pfVar1 <= fVar9 && fVar9 != *pfVar1) && (0 < n_1)) {
        *(float *)(detected_freqs + (long)(int)(pEVar6->field_0).data.p[0] * 4) =
             (float)(state->field_0).field_0.samplerate / (float)n_1;
      }
    }
    (pEVar6->field_0).data.phase =
         *(float *)(detected_freqs + (long)(int)(pEVar6->field_0).data.p[0] * 4) *
         fVar8 * (1.0 / (float)uVar3) + (pEVar6->field_0).data.phase;
    iVar4 = FastFloor((pEVar6->field_0).data.phase);
    (pEVar6->field_0).data.phase = (pEVar6->field_0).data.phase - (float)iVar4;
    for (local_80 = 0; local_80 < outchannels; local_80 = local_80 + 1) {
      fVar9 = (pEVar6->field_0).data.phase;
      uVar7 = i * outchannels + local_80;
      outbuffer[uVar7] =
           ((fVar9 + fVar9 + -1.0) * (pEVar6->field_0).data.env +
           -outbuffer[(uint)(i * outchannels + local_80)]) * fVar2 + outbuffer[uVar7];
    }
  }
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData::Data* data = &state->GetEffectData<EffectData>()->data;
        const float sampletime = 1.0f / state->samplerate;
        const float monitor = data->p[P_MONITOR];
        const float oscpitch = powf(2.0f, data->p[P_OSCPITCH] / 12.0f) * sampletime;

        memcpy(outbuffer, inbuffer, length * inchannels * sizeof(float));

        for (unsigned int n = 0; n < length; n++)
        {
            float input = inbuffer[n * inchannels];

            data->env += (fabsf(input) - data->env) * 0.01f;
            data->buffer[data->counter + WINSIZE - HOPSIZE] = input;

            if (++data->counter == HOPSIZE)
            {
                data->counter = 0;

                for (int i = 0; i < WINSIZE - HOPSIZE; i++)
                    data->buffer[i] = data->buffer[i + HOPSIZE];

                for (int i = 0; i < WINSIZE; i++)
                {
                    data->spec[i].re = data->buffer[i] * data->window[i];
                    data->spec[i].im = 0.0f;
                }

                for (int i = WINSIZE; i < FFTSIZE; i++)
                {
                    data->spec[i].re = 0.0f;
                    data->spec[i].im = 0.0f;
                }

                FFT::Forward(data->spec, FFTSIZE, true);

                int locut = (int)data->p[P_LOCUT];
                int hicut = (int)data->p[P_HICUT];
                memset(data->spec, 0, sizeof(UnityComplexNumber) * locut);
                memset(data->spec + hicut, 0, sizeof(UnityComplexNumber) * (FFTSIZE - 2 * hicut));
                memset(data->spec + FFTSIZE - locut, 0, sizeof(UnityComplexNumber) * locut);

                // Fast autocorrelation
                for (int i = 0; i < FFTSIZE; i++)
                {
                    data->spec[i].re = data->spec[i].Magnitude2() * data->acnf[n]; // Correct for windowing
                    data->spec[i].im = 0.0f;
                    debugdata[i] = data->spec[i].re;
                }
                FFT::Backward(data->spec, FFTSIZE, true);

                int startbin = (int)data->p[P_LOBIN];
                int endbin = (int)data->p[P_HIBIN];
                int maxbin = 0;
                float maxval = 0.0f;
                for (int n = startbin; n < endbin; n++)
                {
                    float a = data->spec[n].re;
                    if (a > maxval)
                    {
                        maxbin = n;
                        maxval = a;
                    }
                }

                if (data->env > data->p[P_THR] && maxbin > 0)
                    detected_freqs[(int)data->p[P_INDEX]] = (float)state->samplerate / (float)maxbin;
            }

            data->phase += detected_freqs[(int)data->p[P_INDEX]] * oscpitch;
            data->phase -= FastFloor(data->phase);

            for (int c = 0; c < outchannels; c++)
                outbuffer[n * outchannels + c] += ((data->phase * 2.0f - 1.0f) * data->env - outbuffer[n * outchannels + c]) * monitor;
        }

        return UNITY_AUDIODSP_OK;
    }